

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

void breakstat(LexState *ls)

{
  FuncState *fs;
  int l2;
  byte bVar1;
  BlockCnt *pBVar2;
  
  fs = ls->fs;
  pBVar2 = (BlockCnt *)&fs->bl;
  bVar1 = 0;
  while (pBVar2 = pBVar2->previous, pBVar2 != (BlockCnt *)0x0) {
    if (pBVar2->isbreakable != '\0') goto LAB_001100bd;
    bVar1 = bVar1 | pBVar2->upval;
  }
  luaX_syntaxerror(ls,"no loop to break");
LAB_001100bd:
  if (bVar1 != 0) {
    luaK_codeABC(fs,OP_CLOSE,(uint)pBVar2->nactvar,0,0);
  }
  l2 = luaK_jump(fs);
  luaK_concat(fs,&pBVar2->breaklist,l2);
  return;
}

Assistant:

static void breakstat (LexState *ls) {
  FuncState *fs = ls->fs;
  BlockCnt *bl = fs->bl;
  int upval = 0;
  while (bl && !bl->isbreakable) {
    upval |= bl->upval;
    bl = bl->previous;
  }
  if (!bl)
    luaX_syntaxerror(ls, "no loop to break");
  if (upval)
    luaK_codeABC(fs, OP_CLOSE, bl->nactvar, 0, 0);
  luaK_concat(fs, &bl->breaklist, luaK_jump(fs));
}